

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O3

HighsStatus __thiscall Highs::optionChangeAction(Highs *this)

{
  HighsModel *this_00;
  double *pdVar1;
  pointer pdVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  HighsStatus HVar9;
  int iVar10;
  double dVar11;
  double dVar12;
  
  this_00 = &this->model_;
  bVar4 = HighsLp::isMip(&this_00->lp_);
  iVar10 = (this->options_).super_HighsOptionsStruct.user_bound_scale;
  bVar5 = false;
  dVar11 = 1.0;
  if (iVar10 == (this->model_).lp_.user_bound_scale_) {
    iVar10 = 0;
  }
  else {
    bVar5 = HighsLp::userBoundScaleOk
                      (&this_00->lp_,iVar10,(this->options_).super_HighsOptionsStruct.infinite_bound
                      );
    if (bVar5) {
      iVar10 = (this->options_).super_HighsOptionsStruct.user_bound_scale -
               (this->model_).lp_.user_bound_scale_;
      dVar11 = ldexp(1.0,iVar10);
      bVar5 = false;
    }
    else {
      (this->options_).super_HighsOptionsStruct.user_bound_scale =
           (this->model_).lp_.user_bound_scale_;
      iVar10 = 0;
      highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                   "New user bound scaling yields infinite bound: reverting user bound scaling to %d\n"
                  );
      bVar5 = true;
      dVar11 = 1.0;
    }
  }
  dVar12 = (this->info_).super_HighsInfoStruct.max_primal_infeasibility * dVar11;
  pdVar1 = &(this->options_).super_HighsOptionsStruct.primal_feasibility_tolerance;
  if (dVar12 < *pdVar1 || dVar12 == *pdVar1) {
    if (bVar4) goto LAB_002341aa;
    if ((this->info_).super_HighsInfoStruct.primal_solution_status == 1) {
      highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kInfo,
                   "Option change leads to gain of primal feasibility\n");
      (this->info_).super_HighsInfoStruct.primal_solution_status = 2;
      (this->info_).super_HighsInfoStruct.num_primal_infeasibilities = 0;
    }
LAB_0023424a:
    if (iVar10 != 0) goto LAB_00234253;
  }
  else {
    if ((1.0 < dVar11) && ((this->info_).super_HighsInfoStruct.num_primal_infeasibilities == 0)) {
      this->model_status_ = kMin;
      if ((this->info_).super_HighsInfoStruct.primal_solution_status == 2) {
        highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kInfo,
                     "Option change leads to loss of primal feasibility\n");
      }
      (this->info_).super_HighsInfoStruct.primal_solution_status = 1;
      (this->info_).super_HighsInfoStruct.num_primal_infeasibilities = -1;
    }
LAB_002341aa:
    if (!bVar4 || iVar10 == 0) goto LAB_0023424a;
    this->model_status_ = kMin;
    if (iVar10 < 0) {
      if ((this->info_).super_HighsInfoStruct.primal_solution_status == 2) {
        highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kInfo,
                     "Option change leads to loss of primal feasibility for MIP\n");
      }
      (this->info_).super_HighsInfoStruct.primal_solution_status = 1;
    }
LAB_00234253:
    (this->info_).super_HighsInfoStruct.objective_function_value =
         (this->info_).super_HighsInfoStruct.objective_function_value * dVar11;
    dVar12 = (this->info_).super_HighsInfoStruct.sum_primal_infeasibilities;
    (this->info_).super_HighsInfoStruct.max_primal_infeasibility =
         dVar11 * (this->info_).super_HighsInfoStruct.max_primal_infeasibility;
    (this->info_).super_HighsInfoStruct.sum_primal_infeasibilities = dVar11 * dVar12;
    lVar7 = (long)(this->model_).lp_.num_col_;
    if (0 < lVar7) {
      pdVar2 = (this->solution_).col_value.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar8 = 0;
      do {
        pdVar2[lVar8] = pdVar2[lVar8] * dVar11;
        lVar8 = lVar8 + 1;
      } while (lVar7 != lVar8);
    }
    lVar7 = (long)(this->model_).lp_.num_row_;
    if (0 < lVar7) {
      pdVar2 = (this->solution_).row_value.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar8 = 0;
      do {
        pdVar2[lVar8] = pdVar2[lVar8] * dVar11;
        lVar8 = lVar8 + 1;
      } while (lVar7 != lVar8);
    }
    HighsLp::userBoundScale
              (&this_00->lp_,(this->options_).super_HighsOptionsStruct.user_bound_scale);
  }
  iVar10 = (this->options_).super_HighsOptionsStruct.user_cost_scale;
  dVar11 = 1.0;
  if (iVar10 == (this->model_).lp_.user_cost_scale_) {
    bVar6 = true;
LAB_0023433d:
    bVar3 = false;
  }
  else {
    bVar6 = HighsModel::userCostScaleOk
                      (this_00,iVar10,(this->options_).super_HighsOptionsStruct.small_matrix_value,
                       (this->options_).super_HighsOptionsStruct.large_matrix_value,
                       (this->options_).super_HighsOptionsStruct.infinite_cost);
    if (bVar6) {
      iVar10 = (this->options_).super_HighsOptionsStruct.user_cost_scale -
               (this->model_).lp_.user_cost_scale_;
      bVar6 = iVar10 == 0;
      dVar11 = ldexp(1.0,iVar10);
      goto LAB_0023433d;
    }
    (this->options_).super_HighsOptionsStruct.user_cost_scale = (this->model_).lp_.user_cost_scale_;
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                 "New user cost scaling yields excessive cost coefficient: reverting user cost scaling to %d\n"
                );
    bVar3 = true;
    bVar6 = true;
    dVar11 = 1.0;
  }
  if (bVar4) {
    if (bVar6) goto LAB_002344e9;
    this->model_status_ = kMin;
  }
  else {
    dVar12 = (this->info_).super_HighsInfoStruct.max_dual_infeasibility * dVar11;
    pdVar1 = &(this->options_).super_HighsOptionsStruct.dual_feasibility_tolerance;
    if (dVar12 < *pdVar1 || dVar12 == *pdVar1) {
      if ((this->info_).super_HighsInfoStruct.dual_solution_status == 1) {
        highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kInfo,
                     "Option change leads to gain of dual feasibility\n");
        (this->info_).super_HighsInfoStruct.dual_solution_status = 2;
        (this->info_).super_HighsInfoStruct.num_dual_infeasibilities = 0;
      }
    }
    else if ((1.0 < dVar11) && ((this->info_).super_HighsInfoStruct.num_dual_infeasibilities == 0))
    {
      this->model_status_ = kMin;
      if ((this->info_).super_HighsInfoStruct.dual_solution_status == 2) {
        highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kInfo,
                     "Option change leads to loss of dual feasibility\n");
        (this->info_).super_HighsInfoStruct.dual_solution_status = 1;
      }
      (this->info_).super_HighsInfoStruct.num_dual_infeasibilities = -1;
    }
    if (bVar6) goto LAB_002344e9;
  }
  (this->info_).super_HighsInfoStruct.objective_function_value =
       (this->info_).super_HighsInfoStruct.objective_function_value * dVar11;
  dVar12 = (this->info_).super_HighsInfoStruct.sum_dual_infeasibilities;
  (this->info_).super_HighsInfoStruct.max_dual_infeasibility =
       dVar11 * (this->info_).super_HighsInfoStruct.max_dual_infeasibility;
  (this->info_).super_HighsInfoStruct.sum_dual_infeasibilities = dVar11 * dVar12;
  lVar7 = (long)(this->model_).lp_.num_col_;
  if (0 < lVar7) {
    pdVar2 = (this->solution_).col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = 0;
    do {
      pdVar2[lVar8] = pdVar2[lVar8] * dVar11;
      lVar8 = lVar8 + 1;
    } while (lVar7 != lVar8);
  }
  lVar7 = (long)(this->model_).lp_.num_row_;
  if (0 < lVar7) {
    pdVar2 = (this->solution_).row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = 0;
    do {
      pdVar2[lVar8] = pdVar2[lVar8] * dVar11;
      lVar8 = lVar8 + 1;
    } while (lVar7 != lVar8);
  }
  HighsModel::userCostScale(this_00,(this->options_).super_HighsOptionsStruct.user_cost_scale);
LAB_002344e9:
  if (((this->model_status_ != kOptimal) &&
      ((this->info_).super_HighsInfoStruct.primal_solution_status == 2)) &&
     ((this->info_).super_HighsInfoStruct.dual_solution_status == 2)) {
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kInfo,
                 "Option change leads to gain of optimality\n");
    this->model_status_ = kOptimal;
  }
  HVar9 = kError;
  if (!bVar5 && !bVar3) {
    HVar9 = kOk;
    if (((this->iis_).valid_ == true) &&
       (HVar9 = kOk,
       (this->options_).super_HighsOptionsStruct.iis_strategy != (this->iis_).strategy_)) {
      HighsIis::invalidate(&this->iis_);
    }
  }
  return HVar9;
}

Assistant:

HighsStatus Highs::optionChangeAction() {
  HighsModel& model = this->model_;
  HighsLp& lp = model.lp_;
  HighsInfo& info = this->info_;
  HighsOptions& options = this->options_;
  const bool is_mip = lp.isMip();
  HighsInt dl_user_bound_scale = 0;
  double dl_user_bound_scale_value = 1;
  // Ensure that user bound scaling does not yield infinite bounds
  const bool changed_user_bound_scale =
      options.user_bound_scale != lp.user_bound_scale_;
  bool user_bound_scale_ok =
      !changed_user_bound_scale ||
      lp.userBoundScaleOk(options.user_bound_scale, options.infinite_bound);
  if (!user_bound_scale_ok) {
    options.user_bound_scale = lp.user_bound_scale_;
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "New user bound scaling yields infinite bound: reverting user "
                 "bound scaling to %d\n",
                 int(options.user_bound_scale));
  } else if (changed_user_bound_scale) {
    dl_user_bound_scale = options.user_bound_scale - lp.user_bound_scale_;
    dl_user_bound_scale_value = std::pow(2, dl_user_bound_scale);
  }
  // Now consider impact on primal feasibility of user bound scaling
  // and/or primal_feasibility_tolerance change.
  //
  double new_max_primal_infeasibility =
      info.max_primal_infeasibility * dl_user_bound_scale_value;
  if (new_max_primal_infeasibility > options.primal_feasibility_tolerance) {
    // Not primal feasible: only act if the model is currently primal
    // feasible or dl_user_bound_scale_value > 1
    if (info.num_primal_infeasibilities == 0 && dl_user_bound_scale_value > 1) {
      this->model_status_ = HighsModelStatus::kNotset;
      if (info.primal_solution_status == kSolutionStatusFeasible)
        highsLogUser(options_.log_options, HighsLogType::kInfo,
                     "Option change leads to loss of primal feasibility\n");
      info.primal_solution_status = kSolutionStatusInfeasible;
      info.num_primal_infeasibilities = kHighsIllegalInfeasibilityCount;
    }
  } else if (!is_mip &&
             info.primal_solution_status == kSolutionStatusInfeasible) {
    highsLogUser(options_.log_options, HighsLogType::kInfo,
                 "Option change leads to gain of primal feasibility\n");
    info.primal_solution_status = kSolutionStatusFeasible;
    info.num_primal_infeasibilities = 0;
  }
  if (is_mip && dl_user_bound_scale) {
    // MIP with non-trivial bound scaling loses optimality
    this->model_status_ = HighsModelStatus::kNotset;
    if (dl_user_bound_scale < 0) {
      // MIP with negative bound scaling exponent loses feasibility
      if (info.primal_solution_status == kSolutionStatusFeasible) {
        highsLogUser(
            options_.log_options, HighsLogType::kInfo,
            "Option change leads to loss of primal feasibility for MIP\n");
      }
      info.primal_solution_status = kSolutionStatusInfeasible;
    }
  }
  if (dl_user_bound_scale) {
    // Update info and solution with respect to non-trivial user bound
    // scaling
    //
    // max and sum of infeasibilities scales: num is handled later
    info.objective_function_value *= dl_user_bound_scale_value;
    info.max_primal_infeasibility *= dl_user_bound_scale_value;
    info.sum_primal_infeasibilities *= dl_user_bound_scale_value;
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++)
      this->solution_.col_value[iCol] *= dl_user_bound_scale_value;
    for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++)
      this->solution_.row_value[iRow] *= dl_user_bound_scale_value;
    // Update LP with respect to non-trivial user bound scaling
    lp.userBoundScale(options_.user_bound_scale);
  }
  // Now consider whether options.user_cost_scale has changed
  HighsInt dl_user_cost_scale = 0;
  double dl_user_cost_scale_value = 1;
  const bool changed_user_cost_scale =
      options.user_cost_scale != lp.user_cost_scale_;
  bool user_cost_scale_ok =
      !changed_user_cost_scale ||
      model.userCostScaleOk(options.user_cost_scale, options.small_matrix_value,
                            options.large_matrix_value, options.infinite_cost);
  if (!user_cost_scale_ok) {
    options.user_cost_scale = lp.user_cost_scale_;
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "New user cost scaling yields excessive cost coefficient: "
                 "reverting user cost scaling to %d\n",
                 int(options.user_cost_scale));
  } else if (changed_user_cost_scale) {
    dl_user_cost_scale = options.user_cost_scale - lp.user_cost_scale_;
    dl_user_cost_scale_value = std::pow(2, dl_user_cost_scale);
  }
  if (!is_mip) {
    // Now consider impact on dual feasibility of user cost scaling
    // and/or dual_feasibility_tolerance change
    double new_max_dual_infeasibility =
        info.max_dual_infeasibility * dl_user_cost_scale_value;
    if (new_max_dual_infeasibility > options.dual_feasibility_tolerance) {
      // Not dual feasible: only act if the model is currently dual
      // feasible or dl_user_bound_scale_value > 1
      if (info.num_dual_infeasibilities == 0 && dl_user_cost_scale_value > 1) {
        this->model_status_ = HighsModelStatus::kNotset;
        if (info.dual_solution_status == kSolutionStatusFeasible) {
          highsLogUser(options_.log_options, HighsLogType::kInfo,
                       "Option change leads to loss of dual feasibility\n");
          info.dual_solution_status = kSolutionStatusInfeasible;
        }
        info.num_dual_infeasibilities = kHighsIllegalInfeasibilityCount;
      }
    } else if (info.dual_solution_status == kSolutionStatusInfeasible) {
      highsLogUser(options_.log_options, HighsLogType::kInfo,
                   "Option change leads to gain of dual feasibility\n");
      info.dual_solution_status = kSolutionStatusFeasible;
      info.num_dual_infeasibilities = 0;
    }
  }
  if (dl_user_cost_scale) {
    if (is_mip) {
      // MIP with non-trivial cost scaling loses optimality
      this->model_status_ = HighsModelStatus::kNotset;
    }
    // Now update data and solution with respect to non-trivial user
    // cost scaling
    //
    // max and sum of infeasibilities scales: num is handled earlier
    info.objective_function_value *= dl_user_cost_scale_value;
    info.max_dual_infeasibility *= dl_user_cost_scale_value;
    info.sum_dual_infeasibilities *= dl_user_cost_scale_value;
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++)
      this->solution_.col_dual[iCol] *= dl_user_cost_scale_value;
    for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++)
      this->solution_.row_dual[iRow] *= dl_user_cost_scale_value;
    model.userCostScale(options.user_cost_scale);
  }
  if (this->model_status_ != HighsModelStatus::kOptimal) {
    if (info.primal_solution_status == kSolutionStatusFeasible &&
        info.dual_solution_status == kSolutionStatusFeasible) {
      highsLogUser(options_.log_options, HighsLogType::kInfo,
                   "Option change leads to gain of optimality\n");
      this->model_status_ = HighsModelStatus::kOptimal;
    }
  }
  if (!user_bound_scale_ok || !user_cost_scale_ok) return HighsStatus::kError;
  if (this->iis_.valid_ && options_.iis_strategy != this->iis_.strategy_)
    this->iis_.invalidate();
  return HighsStatus::kOk;
}